

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void ON_Mesh_SetClosedHelper
               (bool bClosedOnly,ON_Mesh *mesh,char *m_mesh_is_manifold,char *m_mesh_is_oriented)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint *puVar6;
  uint *memblock;
  ON_MeshFace *pOVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  char cVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  char cVar20;
  bool bVar21;
  bool bVar22;
  uint Vidbuffer [256];
  uint local_438 [258];
  
  uVar11 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar5 = (mesh->m_F).m_count;
  uVar10 = (ulong)uVar5;
  if (uVar11 < 3 || uVar10 == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
               ,0xe8b,"","Mesh is not valid.");
  }
  else if ((!bClosedOnly) || (3 < uVar5 && 3 < uVar11)) {
    puVar6 = (uint *)0x0;
    if (uVar11 < 0x101) {
      puVar6 = local_438;
    }
    puVar6 = ON_Mesh::GetVertexLocationIds(mesh,1,puVar6,(uint *)0x0);
    if (puVar6 == (uint *)0x0) {
      uVar11 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0xe9d,"","Mesh has corrupt vertex information.");
      cVar13 = '\x02';
      cVar20 = '\x02';
      bClosedOnly = false;
    }
    else {
      memblock = (uint *)onmalloc((ulong)(uVar5 * 4) * 0xc);
      uVar8 = 0;
      uVar12 = 0;
      if (uVar10 != 0) {
        pOVar7 = (mesh->m_F).m_a;
        uVar14 = 0;
        uVar11 = 0;
        do {
          uVar18 = puVar6[pOVar7->vi[0]];
          uVar15 = puVar6[pOVar7->vi[1]];
          uVar8 = uVar14;
          uVar12 = uVar11;
          if (uVar18 == uVar15) break;
          uVar12 = uVar15;
          if (uVar15 < uVar18) {
            uVar12 = uVar18;
          }
          uVar1 = uVar18;
          if (uVar15 <= uVar18) {
            uVar1 = uVar15;
          }
          uVar16 = (ulong)uVar11;
          memblock[uVar16 * 3] = uVar1;
          memblock[uVar16 * 3 + 1] = uVar12;
          memblock[uVar16 * 3 + 2] = (uint)(uVar15 <= uVar18 && uVar18 != uVar15);
          uVar18 = puVar6[pOVar7->vi[2]];
          uVar12 = uVar11 + 1;
          if (uVar15 == uVar18) break;
          uVar1 = uVar18;
          if (uVar18 < uVar15) {
            uVar1 = uVar15;
          }
          uVar2 = uVar15;
          if (uVar18 <= uVar15) {
            uVar2 = uVar18;
          }
          uVar12 = uVar11 + 2;
          uVar16 = (ulong)(uVar11 + 1);
          memblock[uVar16 * 3] = uVar2;
          memblock[uVar16 * 3 + 1] = uVar1;
          memblock[uVar16 * 3 + 2] = (uint)(uVar18 <= uVar15 && uVar15 != uVar18);
          if (pOVar7->vi[2] != pOVar7->vi[3]) {
            uVar15 = puVar6[pOVar7->vi[3]];
            if (uVar18 == uVar15) break;
            uVar1 = uVar15;
            if (uVar15 < uVar18) {
              uVar1 = uVar18;
            }
            uVar2 = uVar18;
            if (uVar15 <= uVar18) {
              uVar2 = uVar15;
            }
            uVar16 = (ulong)uVar12;
            memblock[uVar16 * 3] = uVar2;
            memblock[uVar16 * 3 + 1] = uVar1;
            memblock[uVar16 * 3 + 2] = (uint)(uVar15 <= uVar18 && uVar18 != uVar15);
            uVar12 = uVar11 + 3;
            uVar18 = uVar15;
          }
          uVar15 = puVar6[pOVar7->vi[0]];
          bVar21 = uVar15 <= uVar18;
          bVar22 = uVar18 == uVar15;
          if (bVar22) break;
          uVar1 = uVar15;
          if (bVar21 && !bVar22) {
            uVar1 = uVar18;
          }
          if (!bVar21) {
            uVar15 = uVar18;
          }
          uVar8 = (ulong)uVar12;
          uVar11 = uVar12 + 1;
          memblock[uVar8 * 3] = uVar15;
          memblock[uVar8 * 3 + 1] = uVar1;
          memblock[uVar8 * 3 + 2] = (uint)(bVar21 && !bVar22);
          uVar14 = uVar14 + 1;
          pOVar7 = pOVar7 + 1;
          uVar8 = uVar10;
          uVar12 = uVar11;
        } while (uVar10 != uVar14);
      }
      if (puVar6 != local_438) {
        onfree(puVar6);
      }
      if (((uint)uVar8 == uVar5) && (2 < uVar12)) {
        uVar8 = (ulong)uVar12;
        uVar14 = (ulong)(uVar12 >> 1);
        uVar10 = uVar8 - 1;
        do {
          if (uVar14 == 0) {
            uVar11 = memblock[uVar10 * 3];
            uVar18 = memblock[uVar10 * 3 + 1];
            uVar15 = memblock[uVar10 * 3 + 2];
            *(undefined8 *)(memblock + uVar10 * 3) = *(undefined8 *)memblock;
            memblock[uVar10 * 3 + 2] = memblock[2];
            uVar10 = uVar10 - 1;
            if (uVar10 == 0) goto LAB_00506a8d;
            uVar14 = 0;
          }
          else {
            uVar14 = uVar14 - 1;
            uVar11 = memblock[uVar14 * 3];
            uVar18 = memblock[uVar14 * 3 + 1];
            uVar15 = memblock[uVar14 * 3 + 2];
          }
          uVar16 = uVar14;
          if (uVar14 * 2 < uVar10) {
            uVar17 = uVar14 * 2 | 1;
            do {
              if (uVar17 < uVar10) {
                if (memblock[uVar17 * 3] < memblock[uVar17 * 3 + 3]) {
LAB_005069de:
                  uVar17 = uVar17 + 1;
                }
                else if (memblock[uVar17 * 3] == memblock[uVar17 * 3 + 3]) {
                  if ((memblock[uVar17 * 3 + 1] < memblock[uVar17 * 3 + 4]) ||
                     ((memblock[uVar17 * 3 + 1] == memblock[uVar17 * 3 + 4] &&
                      (memblock[uVar17 * 3 + 2] < memblock[uVar17 * 3 + 5])))) goto LAB_005069de;
                }
              }
              puVar6 = memblock + uVar17 * 3;
              if ((uVar11 < memblock[uVar17 * 3]) ||
                 ((uVar3 = uVar10, uVar11 == memblock[uVar17 * 3] &&
                  ((uVar18 < puVar6[1] || ((uVar18 == puVar6[1] && (uVar15 < puVar6[2])))))))) {
                memblock[uVar16 * 3 + 2] = puVar6[2];
                *(undefined8 *)(memblock + uVar16 * 3) = *(undefined8 *)puVar6;
                uVar16 = uVar17;
                uVar3 = uVar17 * 2;
              }
              uVar17 = uVar3 + 1;
            } while (uVar17 <= uVar10);
          }
          memblock[uVar16 * 3] = uVar11;
          memblock[uVar16 * 3 + 1] = uVar18;
          memblock[uVar16 * 3 + 2] = uVar15;
        } while( true );
      }
      uVar11 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0xef1,"","Mesh is corrupt or collapsed");
      cVar13 = '\x02';
      cVar20 = '\x02';
      bClosedOnly = false;
    }
    goto LAB_00506c5f;
  }
  uVar11 = 0;
  cVar13 = '\x02';
  cVar20 = '\x02';
  goto LAB_00506c5f;
code_r0x00506b55:
  lVar19 = lVar19 + 1;
  puVar6 = puVar6 + 3;
  uVar18 = uVar18 + 1;
  uVar11 = 0;
  if (bClosedOnly) {
    uVar11 = uVar5 + (int)lVar19;
LAB_00506c3a:
    uVar14 = (ulong)uVar11;
    uVar11 = 0;
LAB_00506c40:
    uVar5 = (uint)uVar14;
    goto LAB_00506c44;
  }
  goto LAB_00506b1a;
LAB_00506ccf:
  uVar5 = uVar5 + (int)lVar19 + 2;
  cVar13 = '\x02';
  cVar20 = '\x02';
LAB_00506c33:
  uVar11 = 0;
  bClosedOnly = false;
  goto LAB_00506c44;
LAB_00506a8d:
  *memblock = uVar11;
  memblock[1] = uVar18;
  memblock[2] = uVar15;
  bVar21 = 5 < uVar12 && 3 < uVar5;
  uVar11 = (uint)bVar21;
  if ((!bClosedOnly) || (bVar21)) {
    cVar13 = '\x01';
    uVar10 = 0;
    bVar4 = 0;
    cVar20 = cVar13;
    do {
      do {
        uVar5 = (uint)uVar10;
        uVar14 = (ulong)uVar12;
        if (uVar12 < uVar5) {
          uVar14 = uVar10 & 0xffffffff;
        }
        uVar16 = uVar10 & 0xffffffff;
        puVar6 = memblock + uVar16 * 3 + 5;
        uVar18 = uVar5 + 3;
        lVar19 = 0;
LAB_00506b1a:
        if ((uVar16 - uVar14) + lVar19 == 0) goto LAB_00506c40;
        if (uVar8 <= uVar16 + lVar19 + 1) {
          uVar11 = uVar5 + 1;
          if (uVar5 + 1 < uVar12) {
            uVar11 = uVar12;
          }
          goto LAB_00506c3a;
        }
        uVar15 = puVar6[-5];
        if ((uVar15 != puVar6[-2]) || (uVar1 = puVar6[-4], uVar1 != puVar6[-1])) {
          if (!(bool)(cVar13 == '\x02' & bVar4)) goto code_r0x00506b55;
          uVar5 = uVar5 + (int)lVar19 + 1;
          goto LAB_00506c33;
        }
        if (puVar6[-3] == *puVar6) {
          cVar13 = '\x02';
        }
        uVar10 = uVar16 + lVar19 + 2;
      } while (((uVar12 <= (uint)uVar10) || (uVar15 != memblock[(uVar10 & 0xffffffff) * 3])) ||
              (uVar1 != memblock[(uVar10 & 0xffffffff) * 3 + 1]));
      if (uVar11 == 0) goto LAB_00506ccf;
      uVar10 = uVar16 + lVar19 + 3;
      if ((uint)uVar10 < uVar12) {
        uVar10 = uVar10 & 0xffffffff;
        puVar6 = memblock + (ulong)uVar18 * 3 + 1;
        do {
          if ((uVar15 != puVar6[-1]) || (uVar1 != *puVar6)) goto LAB_00506c14;
          uVar10 = uVar10 + 1;
          puVar6 = puVar6 + 3;
        } while (uVar10 < uVar8);
        uVar10 = (ulong)uVar12;
      }
LAB_00506c14:
      bVar4 = 1;
      uVar11 = 1;
      cVar13 = '\x02';
      cVar20 = cVar13;
    } while( true );
  }
  cVar13 = '\x01';
  uVar5 = 0;
  cVar20 = '\x01';
LAB_00506c44:
  bClosedOnly = (bool)(uVar5 < uVar12 & bClosedOnly);
  onfree(memblock);
LAB_00506c5f:
  bVar21 = true;
  cVar9 = '\x01';
  if (1 < uVar11 - 1) {
    if (uVar11 == 0) {
      mesh->m_mesh_is_solid = '\x03';
      cVar9 = '\x02';
      bVar21 = true;
    }
    else {
      bVar21 = false;
      cVar9 = '\0';
    }
  }
  if ((!bVar21) || (mesh->m_mesh_is_closed != cVar9)) {
    mesh->m_mesh_is_closed = cVar9;
    mesh->m_mesh_is_manifold = '\0';
    mesh->m_mesh_is_oriented = '\0';
  }
  if (bClosedOnly == false) {
    cVar9 = '\x02';
    if (cVar20 != '\x02') {
      cVar9 = cVar13;
    }
    *m_mesh_is_manifold = cVar20;
    *m_mesh_is_oriented = cVar9;
  }
  return;
}

Assistant:

static void ON_Mesh_SetClosedHelper( 
          bool bClosedOnly,
          const ON_Mesh& mesh,
          const char& m_mesh_is_manifold,
          const char& m_mesh_is_oriented
          )
{
  // thread safe lazy evaluation for mesh's m_mesh_is_... flags
  // Sets: m_mesh_is_closed.
  //       If bClosedOnly is false, also sets m_mesh_is_manifold and m_mesh_is_oriented
  int is_closed = 0;
  char is_manifold = 2;
  char is_oriented = 2;
  for (;;)
  {
    const unsigned int Vcount = mesh.m_V.UnsignedCount();
    const unsigned int Fcount = mesh.m_F.UnsignedCount();
    if ( Vcount < 3 || Fcount < 1 )
    {
      ON_ERROR("Mesh is not valid.");
      break;
    }
    if ( bClosedOnly && (Vcount < 4 || Fcount < 4) )
    {
      // not closed - don't waste any more time.
      break;
    }

    unsigned int i, j;
    unsigned int Vidbuffer[256];
    unsigned int* Vid = mesh.GetVertexLocationIds(
                     1,
                     (Vcount*sizeof(*Vid) <= sizeof(Vidbuffer) ? &Vidbuffer[0] : nullptr),
                     nullptr // unwanted Vindex[] values
                    );
    if ( 0 == Vid )
    {
      ON_ERROR("Mesh has corrupt vertex information.");
      bClosedOnly = false;
      break;
    }

    // build an edge list where the "vertex" indices identify unique 3d locations
    ON_3udex* E_list = (ON_3udex*)onmalloc(4 * Fcount*sizeof(E_list[0]));
    ON_3udex E;
    unsigned int Vid0;
    const int* fvi;
    unsigned int E_count = 0;
    const ON_MeshFace* F = mesh.m_F.Array();
    for ( j = 0; j < Fcount; j++ )
    {
      fvi = F[j].vi;
      E.i = Vid[fvi[0]];
      Vid0 = E.j = Vid[fvi[1]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      E.i = Vid0;
      Vid0 = E.j = Vid[fvi[2]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;

      if ( fvi[2] != fvi[3] )
      {
        // quad
        E.i = Vid0;
        Vid0 = E.j = Vid[fvi[3]];
        if ( E.i == E.j )
          break;
        if ( E.i > E.j )
        {
          i = E.i; E.i = E.j; E.j = i;
          E.k = 1;
        }
        else
        {
          E.k = 0;
        }
        E_list[E_count++] = E;
      }

      E.i = Vid0;
      E.j = Vid[fvi[0]];
      if ( E.i == E.j )
        break;
      if ( E.i > E.j )
      {
        i = E.i; E.i = E.j; E.j = i;
        E.k = 1;
      }
      else
      {
        E.k = 0;
      }
      E_list[E_count++] = E;
    }
    if ( Vid != &Vidbuffer[0] )
      onfree(Vid);

    if ( E_count < 3 || j != Fcount )
    {
      ON_ERROR("Mesh is corrupt or collapsed");
      bClosedOnly = false;
      break;
    }

    // sort the the edges
    ON_hsort_3udex(E_list,E_count);

    // Look for duplicate edges.  If we find an edge with no duplicate,
    // then the mesh is open.  It is possible that degenerate meshes,
    // like a flattened box, will be flagged as closed.
    is_closed = (Fcount >= 4 && E_count >= 6) ? 1 : 0;
    is_oriented = 1;
    is_manifold = 1;
    i = 0;
    if ( !bClosedOnly || 1 == is_closed ) for ( i = 0; i < E_count; /*empty iterator*/ )
    {
      E = E_list[i];
      if ( ++i >= E_count )
      {
        // boundary edge (and the last edge in our list)
        is_closed = 0;
        break;
      }

      if ( E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // boundary edge
        is_closed = 0;
        if ( 2 == is_oriented && 2 == is_manifold )
        {
          bClosedOnly = false;
          break;
        }
        if ( bClosedOnly )
          break; // don't spend time with further testing
        continue;
      }

      if ( E.k == E_list[i].k )
      {
        // opposite face normals along this edge - mesh is not oriented
        is_oriented = 2; 
      }

      if ( ++i >= E_count || E.i != E_list[i].i || E.j != E_list[i].j )
      {
        // two faces share this edge
        continue;
      }

      // three or more faces share this edge - mesh is not oriented manifold
      is_oriented = 2; 
      is_manifold = 2; 
      if ( 0 == is_closed )
      {
        bClosedOnly = false;
        break;
      }

      // Check for more faces sharing this edge.
      for ( i++; i < E_count; i++ )
      {
        if ( E.i != E_list[i].i || E.j != E_list[i].j )
        {
          // the edges E and Eid_list[i] are in different locations
          break;
        }
      }
    }
    if (E_count > 0 && i >= E_count)
    {
      // is_manifold and is_oriented are set correctly
      bClosedOnly = false;
    }

    onfree(E_list);

    break;
  }

  const_cast<ON_Mesh&>(mesh).SetClosed(is_closed);
  if ( !bClosedOnly )
  {
    // is_manifold and is_oriented are set correctly
    if ( 2 == is_manifold )
      is_oriented = 2;
    const_cast<char&>(m_mesh_is_manifold) = is_manifold;
    const_cast<char&>(m_mesh_is_oriented) = is_oriented;
  }
}